

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O1

void __thiscall HPresolve::testAnAR(HPresolve *this,int post)

{
  uint uVar1;
  pointer piVar2;
  pointer piVar3;
  pointer pdVar4;
  pointer piVar5;
  bool bVar6;
  byte bVar7;
  HPresolve *pHVar8;
  ulong uVar9;
  ostream *poVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  ulong uVar23;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  
  pHVar8 = (HPresolve *)&(this->super_HPreData).numColOriginal;
  if (post == 0) {
    pHVar8 = this;
  }
  uVar1 = (pHVar8->super_HPreData).numCol;
  iVar22 = (&(this->super_HPreData).numRow)[post != 0];
  uVar11 = (ulong)iVar22;
  if (0 < (long)uVar11) {
    uVar23 = 0;
    do {
      if (0 < (int)uVar1) {
        uVar15 = uVar23 + 1;
        uVar21 = 0;
        do {
          if (post == 0) {
            piVar2 = (this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            uVar13 = (long)(this->super_HPreData).flagRow.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)piVar2 >> 2;
            uVar20 = uVar23;
            if (uVar13 <= uVar23) goto LAB_0014505a;
            if (piVar2[uVar23] != 0) {
              piVar2 = (this->super_HPreData).flagCol.super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              uVar13 = (long)(this->super_HPreData).flagCol.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)piVar2 >> 2;
              uVar20 = uVar21;
              if (uVar13 <= uVar21) goto LAB_0014505a;
              if (piVar2[uVar21] != 0) goto LAB_001448d4;
            }
          }
          else {
LAB_001448d4:
            piVar2 = (this->super_HPreData).Astart.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            uVar13 = (long)(this->super_HPreData).Astart.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)piVar2 >> 2;
            uVar20 = uVar21;
            if (uVar13 <= uVar21) goto LAB_0014505a;
            piVar3 = (this->super_HPreData).Aend.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            uVar14 = (long)(this->super_HPreData).Aend.super__Vector_base<int,_std::allocator<int>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)piVar3 >> 2;
            uVar13 = uVar14;
            if (uVar14 <= uVar21) goto LAB_0014505a;
            iVar19 = piVar2[uVar21];
            uVar16 = (ulong)iVar19;
            iVar17 = piVar3[uVar21];
            piVar2 = (this->super_HPreData).Aindex.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            uVar9 = (long)(this->super_HPreData).Aindex.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)piVar2 >> 2;
            pdVar4 = (this->super_HPreData).Avalue.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar12 = (long)(this->super_HPreData).Avalue.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)pdVar4 >> 3;
            if (iVar17 < iVar19) {
              iVar17 = iVar19;
            }
            bVar6 = false;
            uVar18 = uVar16;
            while ((long)iVar17 != uVar18) {
              if (uVar9 <= uVar18) goto LAB_00145022;
              if (uVar23 == (uint)piVar2[uVar18]) {
                uVar13 = uVar12;
                uVar20 = uVar18;
                if (uVar12 <= uVar18) goto LAB_0014505a;
                in_XMM1_Qa = pdVar4[uVar18];
                bVar6 = true;
              }
              uVar18 = uVar18 + 1;
              uVar13 = uVar14;
              uVar20 = uVar21;
              if (uVar14 <= uVar21) goto LAB_0014505a;
            }
            piVar2 = (this->super_HPreData).ARstart.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            uVar14 = (long)(this->super_HPreData).ARstart.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)piVar2 >> 2;
            uVar13 = uVar14;
            uVar20 = uVar23;
            if ((uVar14 <= uVar23) || (uVar20 = uVar15, uVar14 <= uVar15)) goto LAB_0014505a;
            iVar19 = piVar2[uVar23];
            uVar16 = (ulong)iVar19;
            piVar3 = (this->super_HPreData).ARindex.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            uVar9 = (long)(this->super_HPreData).ARindex.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)piVar3 >> 2;
            pdVar4 = (this->super_HPreData).ARvalue.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar12 = (long)(this->super_HPreData).ARvalue.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)pdVar4 >> 3;
            iVar17 = piVar2[uVar23 + 1];
            if (piVar2[uVar23 + 1] < iVar19) {
              iVar17 = iVar19;
            }
            bVar7 = 0;
            uVar18 = uVar16;
            while ((long)iVar17 != uVar18) {
              if (uVar9 <= uVar18) goto LAB_00145022;
              if (uVar21 == (uint)piVar3[uVar18]) {
                uVar13 = uVar12;
                uVar20 = uVar18;
                if (uVar12 <= uVar18) goto LAB_0014505a;
                in_XMM0_Qa = pdVar4[uVar18];
                bVar7 = 1;
              }
              uVar18 = uVar18 + 1;
              uVar13 = uVar14;
              uVar20 = uVar15;
              if (uVar14 <= uVar15) goto LAB_0014505a;
            }
            if ((bool)(bVar7 ^ bVar6)) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"    MATRIX is0   DIFF row=",0x1a);
              poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar23);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10," col=",5);
              poVar10 = (ostream *)std::ostream::operator<<(poVar10,(int)uVar21);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,"           ------------A: ",0x1a);
              poVar10 = std::ostream::_M_insert<bool>(SUB81(poVar10,0));
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"  AR: ",6);
              poVar10 = std::ostream::_M_insert<bool>(SUB81(poVar10,0));
LAB_00144b78:
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
              std::ostream::put((char)poVar10);
              std::ostream::flush();
            }
            else if (bVar6) {
              if ((in_XMM1_Qa != in_XMM0_Qa) || (NAN(in_XMM1_Qa) || NAN(in_XMM0_Qa))) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"    MATRIX VAL  DIFF row=",0x19);
                poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar23);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10," col=",5);
                poVar10 = (ostream *)std::ostream::operator<<(poVar10,(int)uVar21);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,"           ------------A: ",0x1a);
                poVar10 = std::ostream::_M_insert<double>(in_XMM1_Qa);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"  AR: ",6);
                poVar10 = std::ostream::_M_insert<double>(in_XMM0_Qa);
                goto LAB_00144b78;
              }
            }
          }
          uVar21 = uVar21 + 1;
        } while (uVar21 != uVar1);
      }
      uVar23 = uVar23 + 1;
    } while (uVar23 != uVar11);
  }
  if (post == 0) {
    if (0 < iVar22) {
      uVar23 = 0;
      do {
        piVar2 = (this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar13 = (long)(this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)piVar2 >> 2;
        uVar20 = uVar23;
        if (uVar13 <= uVar23) goto LAB_0014505a;
        if (piVar2[uVar23] != 0) {
          piVar2 = (this->super_HPreData).ARstart.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar15 = (long)(this->super_HPreData).ARstart.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)piVar2 >> 2;
          uVar13 = uVar15;
          if ((uVar15 <= uVar23) || (uVar21 = uVar23 + 1, uVar20 = uVar21, uVar15 <= uVar21))
          goto LAB_0014505a;
          iVar22 = piVar2[uVar23];
          uVar14 = (ulong)iVar22;
          piVar3 = (this->super_HPreData).ARindex.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar9 = (long)(this->super_HPreData).ARindex.super__Vector_base<int,_std::allocator<int>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)piVar3 >> 2;
          piVar5 = (this->super_HPreData).flagCol.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar12 = (long)(this->super_HPreData).flagCol.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)piVar5 >> 2;
          iVar19 = piVar2[uVar23 + 1];
          if (piVar2[uVar23 + 1] < iVar22) {
            iVar19 = iVar22;
          }
          iVar22 = 0;
          uVar16 = uVar14;
          while ((long)iVar19 != uVar16) {
            if (uVar9 <= uVar16) {
              uVar13 = uVar9;
              uVar20 = uVar14;
              if (uVar14 < uVar9) {
                uVar20 = uVar9;
              }
              goto LAB_0014505a;
            }
            uVar20 = (ulong)piVar3[uVar16];
            uVar13 = uVar12;
            if (uVar12 <= uVar20) goto LAB_0014505a;
            iVar22 = (iVar22 + 1) - (uint)(piVar5[uVar20] == 0);
            uVar16 = uVar16 + 1;
            uVar13 = uVar15;
            uVar20 = uVar21;
            if (uVar15 <= uVar21) goto LAB_0014505a;
          }
          piVar2 = (this->super_HPreData).nzRow.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar13 = (long)(this->super_HPreData).nzRow.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)piVar2 >> 2;
          uVar20 = uVar23;
          if (uVar13 <= uVar23) goto LAB_0014505a;
          if (iVar22 != piVar2[uVar23]) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"    NZ ROW      DIFF row=",0x19);
            poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar23);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10," nzRow=",7);
            piVar2 = (this->super_HPreData).nzRow.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            uVar13 = (long)(this->super_HPreData).nzRow.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)piVar2 >> 2;
            if (uVar13 <= uVar23) goto LAB_0014505a;
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,piVar2[uVar23]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10," actually ",10);
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar22);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"------------",0xc);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
            std::ostream::put((char)poVar10);
            std::ostream::flush();
          }
        }
        uVar23 = uVar23 + 1;
      } while (uVar23 != uVar11);
    }
    if (0 < (int)uVar1) {
      uVar11 = 0;
      do {
        piVar2 = (this->super_HPreData).flagCol.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar13 = (long)(this->super_HPreData).flagCol.super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)piVar2 >> 2;
        uVar20 = uVar11;
        if (uVar13 <= uVar11) goto LAB_0014505a;
        if (piVar2[uVar11] != 0) {
          piVar2 = (this->super_HPreData).Astart.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar13 = (long)(this->super_HPreData).Astart.super__Vector_base<int,_std::allocator<int>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)piVar2 >> 2;
          if (uVar13 <= uVar11) goto LAB_0014505a;
          piVar3 = (this->super_HPreData).Aend.super__Vector_base<int,_std::allocator<int>_>._M_impl
                   .super__Vector_impl_data._M_start;
          uVar23 = (long)(this->super_HPreData).Aend.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)piVar3 >> 2;
          uVar13 = uVar23;
          if (uVar23 <= uVar11) goto LAB_0014505a;
          iVar22 = piVar2[uVar11];
          uVar16 = (ulong)iVar22;
          iVar19 = piVar3[uVar11];
          piVar2 = (this->super_HPreData).Aindex.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar9 = (long)(this->super_HPreData).Aindex.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)piVar2 >> 2;
          piVar3 = (this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar15 = (long)(this->super_HPreData).flagRow.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)piVar3 >> 2;
          if (iVar19 < iVar22) {
            iVar19 = iVar22;
          }
          iVar22 = 0;
          uVar21 = uVar16;
          while ((long)iVar19 != uVar21) {
            if (uVar9 <= uVar21) goto LAB_00145022;
            uVar20 = (ulong)piVar2[uVar21];
            uVar13 = uVar15;
            if (uVar15 <= uVar20) goto LAB_0014505a;
            iVar22 = (iVar22 + 1) - (uint)(piVar3[uVar20] == 0);
            uVar21 = uVar21 + 1;
            uVar13 = uVar23;
            uVar20 = uVar11;
            if (uVar23 <= uVar11) goto LAB_0014505a;
          }
          piVar2 = (this->super_HPreData).nzCol.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar13 = (long)(this->super_HPreData).nzCol.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)piVar2 >> 2;
          uVar20 = uVar11;
          if (uVar13 <= uVar11) goto LAB_0014505a;
          if (iVar22 != piVar2[uVar11]) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"    NZ COL      DIFF col=",0x19);
            poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar11);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10," nzCol=",7);
            piVar2 = (this->super_HPreData).nzCol.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            uVar13 = (long)(this->super_HPreData).nzCol.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)piVar2 >> 2;
            if (uVar13 <= uVar11) goto LAB_0014505a;
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,piVar2[uVar11]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10," actually ",10);
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar22);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"------------",0xc);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
            std::ostream::put((char)poVar10);
            std::ostream::flush();
          }
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar1);
    }
  }
  return;
LAB_00145022:
  uVar13 = uVar9;
  uVar20 = uVar16;
  if (uVar16 < uVar9) {
    uVar20 = uVar9;
  }
LAB_0014505a:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar20,
             uVar13);
}

Assistant:

void HPresolve::testAnAR(int post) {
	int rows = numRow;
	int cols = numCol;
	int i,j,k;

	double valueA, valueAR;
	bool hasValueA, hasValueAR;

	if (post) {
		rows = numRowOriginal;
		cols = numColOriginal;
	}

	// check that A = AR
	for (i=0; i<rows; ++i) {
		for (j=0; j<cols; ++j) {
			if (post==0)
				if (!flagRow.at(i) || !flagCol.at(j))
				continue;
			hasValueA = false;
			for (k = Astart.at(j); k<Aend.at(j);++k )
				if (Aindex.at(k) == i) {
					hasValueA = true;
					valueA = Avalue.at(k);
				}

			hasValueAR = false;
			for (k = ARstart.at(i); k<ARstart.at(i+1);++k )
				if (ARindex.at(k) == j) {
					hasValueAR = true;
					valueAR = ARvalue.at(k);
				}

			if (hasValueA != hasValueAR)
				cout<<"    MATRIX is0   DIFF row="<<i<< " col="<<j<<"           ------------A: "<<hasValueA<<"  AR: "<<hasValueAR <<endl;
			else if (hasValueA && valueA != valueAR)
				cout<<"    MATRIX VAL  DIFF row="<<i<< " col="<<j<<"           ------------A: "<<valueA<<"  AR: "<<valueAR <<endl;
		}
	}

	if (post == 0) {
		//check nz
		int nz=0;
		for (i=0; i<rows; ++i) {
			if (!flagRow.at(i))
				continue;
			nz=0;
			for (k = ARstart.at(i); k<ARstart.at(i+1);++k )
				if (flagCol.at(ARindex.at(k)))
					nz++;
			if (nz != nzRow.at(i))
				cout<<"    NZ ROW      DIFF row="<<i<< " nzRow="<<nzRow.at(i)<<" actually "<<nz <<"------------"<<endl;
		}

		for (j=0; j<cols; ++j) {
			if (!flagCol.at(j))
				continue;
			nz=0;
			for (k = Astart.at(j); k<Aend.at(j);++k )
				if (flagRow.at(Aindex.at(k)))
					nz++;
			if (nz != nzCol.at(j))
				cout<<"    NZ COL      DIFF col="<<j<< " nzCol="<<nzCol.at(j)<<" actually "<<nz <<"------------"<<endl;
		}
	}

}